

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

longlong ImGui::RoundScalarWithFormatT<long_long>(char *format,ImGuiDataType data_type,longlong v)

{
  char *fmt_in;
  double dVar1;
  char **local_a0;
  char *p;
  char v_str [64];
  char fmt_sanitized [32];
  char *fmt_start;
  longlong v_local;
  ImGuiDataType data_type_local;
  char *format_local;
  
  if (data_type != 8 && data_type != 9) {
    __assert_fail("data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                  ,0x845,
                  "TYPE ImGui::RoundScalarWithFormatT(const char *, ImGuiDataType, TYPE) [TYPE = long long]"
                 );
  }
  fmt_in = ImParseFormatFindStart(format);
  format_local = (char *)v;
  if ((*fmt_in == '%') && (fmt_in[1] != '%')) {
    ImParseFormatSanitizeForPrinting(fmt_in,v_str + 0x38,0x20);
    ImFormatString((char *)&p,0x40,v_str + 0x38,v);
    for (local_a0 = &p; *(char *)local_a0 == ' '; local_a0 = (char **)((long)local_a0 + 1)) {
    }
    dVar1 = atof((char *)local_a0);
    format_local = (char *)(long)dVar1;
  }
  return (longlong)format_local;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    IM_UNUSED(data_type);
    IM_ASSERT(data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    ImParseFormatSanitizeForPrinting(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    v = (TYPE)ImAtof(p);

    return v;
}